

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

mem_hash_record * MemHashGetEntry(mem_hash_kv_engine *pEngine,void *pKey,int nKeyLen)

{
  mem_hash_record *pmVar1;
  sxu32 sVar2;
  sxi32 sVar3;
  mem_hash_record **ppmVar4;
  
  sVar2 = (*pEngine->xHash)(pKey,nKeyLen);
  ppmVar4 = pEngine->apBucket + (pEngine->nBucket - 1 & sVar2);
  while( true ) {
    pmVar1 = *ppmVar4;
    if (pmVar1 == (mem_hash_record *)0x0) {
      return (mem_hash_record *)0x0;
    }
    if (((pmVar1->nHash == sVar2) && (pmVar1->nKeyLen == nKeyLen)) &&
       (sVar3 = (*pEngine->xCmp)(pmVar1->pKey,pKey,nKeyLen), sVar3 == 0)) break;
    ppmVar4 = &pmVar1->pNextHash;
  }
  return pmVar1;
}

Assistant:

static mem_hash_record * MemHashGetEntry(
	mem_hash_kv_engine *pEngine,
	const void *pKey,int nKeyLen
	)
{
	mem_hash_record *pEntry;
	sxu32 nHash,nBucket;
	/* Hash the entry */
	nHash = pEngine->xHash(pKey,(sxu32)nKeyLen);
	nBucket = nHash & (pEngine->nBucket - 1);
	pEntry = pEngine->apBucket[nBucket];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->nHash == nHash && pEntry->nKeyLen == (sxu32)nKeyLen && 
			pEngine->xCmp(pEntry->pKey,pKey,pEntry->nKeyLen) == 0 ){
				return pEntry;
		}
		pEntry = pEntry->pNextHash;
	}
	/* No such entry */
	return 0;
}